

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_matcher.cpp
# Opt level: O1

idx_t duckdb::GenericNestedMatch<true,duckdb::LessThan>
                (Vector *lhs_vector,TupleDataVectorFormat *param_2,SelectionVector *sel,idx_t count,
                TupleDataLayout *rhs_layout,Vector *rhs_row_locations,idx_t col_idx,
                vector<duckdb::MatchFunction,_true> *param_8,SelectionVector *no_match_sel,
                idx_t *no_match_count)

{
  const_reference other;
  SelectionVector *pSVar1;
  idx_t iVar2;
  SelectionVector no_match_sel_offset;
  TupleDataGatherFunction gather_function;
  LogicalType local_118;
  Vector key;
  Vector sliced;
  
  other = vector<duckdb::LogicalType,_true>::operator[](&rhs_layout->types,col_idx);
  LogicalType::LogicalType(&local_118,other);
  Vector::Vector(&key,&local_118,0x800);
  LogicalType::~LogicalType(&local_118);
  TupleDataCollection::GetGatherFunction(&gather_function,other);
  pSVar1 = FlatVector::IncrementalSelectionVector();
  (*gather_function.function)
            (rhs_layout,rhs_row_locations,col_idx,sel,count,&key,pSVar1,
             (optional_ptr<duckdb::Vector,_true>)0x0,&gather_function.child_functions);
  pSVar1 = FlatVector::IncrementalSelectionVector();
  Vector::Verify(&key,pSVar1,count);
  Vector::Vector(&sliced,lhs_vector,sel,count);
  no_match_sel_offset.sel_vector = no_match_sel->sel_vector + *no_match_count;
  no_match_sel_offset.selection_data.internal.
  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  no_match_sel_offset.selection_data.internal.
  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
  ;
  iVar2 = VectorOperations::DistinctLessThan
                    (&sliced,&key,(optional_ptr<const_duckdb::SelectionVector,_true>)sel,count,
                     (optional_ptr<duckdb::SelectionVector,_true>)sel,&no_match_sel_offset,
                     (optional_ptr<duckdb::ValidityMask,_true>)0x0);
  *no_match_count = *no_match_count + (count - iVar2);
  if (no_match_sel_offset.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (no_match_sel_offset.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (sliced.auxiliary.internal.super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (sliced.auxiliary.internal.
               super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (sliced.buffer.internal.super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (sliced.buffer.internal.
               super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (sliced.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (sliced.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  LogicalType::~LogicalType(&sliced.type);
  ::std::vector<duckdb::TupleDataGatherFunction,_std::allocator<duckdb::TupleDataGatherFunction>_>::
  ~vector(&gather_function.child_functions.
           super_vector<duckdb::TupleDataGatherFunction,_std::allocator<duckdb::TupleDataGatherFunction>_>
         );
  if (key.auxiliary.internal.super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (key.auxiliary.internal.
               super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (key.buffer.internal.super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (key.buffer.internal.
               super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (key.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (key.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  LogicalType::~LogicalType(&key.type);
  return iVar2;
}

Assistant:

static idx_t GenericNestedMatch(Vector &lhs_vector, const TupleDataVectorFormat &, SelectionVector &sel,
                                const idx_t count, const TupleDataLayout &rhs_layout, Vector &rhs_row_locations,
                                const idx_t col_idx, const vector<MatchFunction> &, SelectionVector *no_match_sel,
                                idx_t &no_match_count) {
	const auto &type = rhs_layout.GetTypes()[col_idx];

	// Gather a dense Vector containing the column values being matched
	Vector key(type);
	const auto gather_function = TupleDataCollection::GetGatherFunction(type);
	gather_function.function(rhs_layout, rhs_row_locations, col_idx, sel, count, key,
	                         *FlatVector::IncrementalSelectionVector(), nullptr, gather_function.child_functions);
	Vector::Verify(key, *FlatVector::IncrementalSelectionVector(), count);

	// Densify the input column
	Vector sliced(lhs_vector, sel, count);

	if (NO_MATCH_SEL) {
		SelectionVector no_match_sel_offset(no_match_sel->data() + no_match_count);
		auto match_count = SelectComparison<OP>(sliced, key, sel, count, &sel, &no_match_sel_offset);
		no_match_count += count - match_count;
		return match_count;
	}
	return SelectComparison<OP>(sliced, key, sel, count, &sel, nullptr);
}